

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
basic_cbor_encoder(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  binary_stream_sink *sink,cbor_encode_options *options,allocator<char> *alloc)

{
  bool bVar1;
  cbor_encode_options *in_RDX;
  basic_json_visitor<char> *in_RDI;
  binary_stream_sink *in_stack_ffffffffffffff78;
  binary_stream_sink *in_stack_ffffffffffffff80;
  allocator *__a;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  uint64_t in_stack_ffffffffffffffc8;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffffd0
  ;
  
  basic_json_visitor<char>::basic_json_visitor(in_RDI);
  in_RDI->_vptr_basic_json_visitor = (_func_int **)&PTR__basic_cbor_encoder_01336f68;
  binary_stream_sink::binary_stream_sink(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  cbor_encode_options::cbor_encode_options
            ((cbor_encode_options *)in_stack_ffffffffffffff80,
             (cbor_encode_options *)in_stack_ffffffffffffff78);
  __a = (allocator *)(in_RDI + 0xc);
  std::allocator<char>::allocator(__a);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             *)(in_RDI + 0xd);
  std::
  allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>
  ::allocator<char>((allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>
                     *)in_stack_ffffffffffffff80,(allocator<char> *)in_stack_ffffffffffffff78);
  std::
  vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ::vector((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            *)in_stack_ffffffffffffff80,(allocator_type *)in_stack_ffffffffffffff78);
  std::
  allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>
  ::~allocator((allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>
                *)0x30b6bd);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::allocator<char>((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                     *)in_stack_ffffffffffffff80,(allocator<char> *)in_stack_ffffffffffffff78);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(this_00,(allocator_type *)__a);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                *)0x30b6fa);
  std::
  allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
  ::allocator<char>((allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
                     *)&stack0xffffffffffffffcb,(allocator<char> *)(in_RDI + 0x16));
  std::
  map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
  ::map((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
         *)this_00,(allocator_type *)__a);
  std::
  allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
  ::~allocator((allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
                *)0x30b737);
  in_RDI[0x1c]._vptr_basic_json_visitor = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[0x1d]._vptr_basic_json_visitor = 0;
  bVar1 = cbor_encode_options::pack_strings(in_RDX);
  if (bVar1) {
    write_tag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

basic_cbor_encoder(Sink&& sink, 
                       const cbor_encode_options& options, 
                       const Allocator& alloc = Allocator())
       : sink_(std::forward<Sink>(sink)), 
         options_(options), 
         alloc_(alloc),
         stack_(alloc),
         stringref_map_(alloc),
         bytestringref_map_(alloc)
    {
        if (options.pack_strings())
        {
            write_tag(256);
        }
    }